

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O2

void BinaryCache::PutLexemes(char *path,Lexeme *lexStart,uint lexCount)

{
  uint uVar1;
  CodeDescriptor *pCVar2;
  CodeDescriptor *pCVar3;
  Lexeme *__dest;
  uint index;
  
  uVar1 = NULLC::GetStringHash(path);
  if (uVar1 != lastHash) {
    index = 0;
    while( true ) {
      if (DAT_0041bf2c <= index) {
        __assert_fail("!\"module not found\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                      ,0x92,"void BinaryCache::PutLexemes(const char *, Lexeme *, unsigned int)");
      }
      pCVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                         ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
      pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                         ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
      if (uVar1 == pCVar3->nameHash) break;
      index = index + 1;
    }
    pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
    if (pCVar3->lexemes != (Lexeme *)0x0) {
      __assert_fail("!cache[i].lexemes",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                    ,0x88,"void BinaryCache::PutLexemes(const char *, Lexeme *, unsigned int)");
    }
    __dest = (Lexeme *)operator_new__((ulong)lexCount << 5);
    pCVar2->lexemes = __dest;
    memcpy(__dest,lexStart,(ulong)lexCount << 5);
    pCVar2->lexemeCount = lexCount;
  }
  return;
}

Assistant:

void BinaryCache::PutLexemes(const char* path, Lexeme* lexStart, unsigned lexCount)
{
	unsigned int hash = NULLC::GetStringHash(path);

	if(hash == lastHash)
		return;

	for(unsigned i = 0; i < cache.size(); i++)
	{
		BinaryCache::CodeDescriptor &desc = cache[i];

		if(hash == cache[i].nameHash)
		{
			assert(!cache[i].lexemes);

			desc.lexemes = new Lexeme[lexCount];
			memcpy(desc.lexemes, lexStart, lexCount * sizeof(Lexeme));
			desc.lexemeCount = lexCount;

			return;
		}
	}

	assert(!"module not found");
}